

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionEuler::ComputeInertialForce
          (ChBeamSectionEuler *this,ChVector<double> *mFi,ChVector<double> *mTi,
          ChVector<double> *mWvel,ChVector<double> *mWacc,ChVector<double> *mXacc)

{
  undefined8 uVar1;
  uint uVar2;
  double *pdVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  double dVar9;
  undefined1 auVar8 [16];
  ChVectorN<double,_6> xpp;
  ChVectorN<double,_6> Fipp;
  ChVector<double> mT_quadratic;
  ChVector<double> mF_quadratic;
  ChMatrixNM<double,_6,_6> Mi;
  double local_270;
  double dStack_268;
  double local_260;
  double dStack_258;
  double local_250;
  double dStack_248;
  undefined8 local_240 [3];
  undefined1 local_228 [32];
  ChVector<double> local_208;
  double local_1f0;
  double dStack_1e8;
  double local_1e0;
  double local_1d0;
  double dStack_1c8;
  double local_1c0;
  undefined8 *local_1b8;
  undefined8 local_1b0;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 local_188;
  undefined1 local_180 [32];
  double local_160 [38];
  
  (*(this->super_ChBeamSection)._vptr_ChBeamSection[0xd])(this,local_180);
  uVar2 = -((uint)((ulong)&local_270 >> 3) & 0x1fffffff) & 6;
  uVar5 = 3;
  if (uVar2 < 3) {
    uVar5 = uVar2;
  }
  if (uVar2 != 0) {
    memcpy(&local_270,mXacc,(ulong)(uVar5 * 8));
  }
  if (uVar5 != 3) {
    uVar6 = (ulong)(uVar5 << 3);
    memcpy((void *)((long)&local_270 + uVar6),(void *)((long)mXacc->m_data + uVar6),0x18 - uVar6);
  }
  uVar2 = -((uint)((ulong)&dStack_258 >> 3) & 0x1fffffff) & 7;
  uVar5 = 3;
  if (uVar2 < 3) {
    uVar5 = uVar2;
  }
  memcpy(&dStack_258,mWacc,(ulong)(uVar5 * 8));
  if (uVar2 < 3) {
    uVar6 = (ulong)(uVar5 << 3);
    memcpy((void *)((long)&dStack_258 + uVar6),(void *)((long)mWacc->m_data + uVar6),0x18 - uVar6);
  }
  pdVar3 = local_160;
  lVar4 = 0;
  do {
    dVar7 = local_270 * pdVar3[-4] + local_260 * pdVar3[-2] + local_250 * *pdVar3;
    dVar9 = dStack_268 * pdVar3[-3] + dStack_258 * pdVar3[-1] + dStack_248 * pdVar3[1];
    auVar8._0_8_ = dVar7 + dVar9;
    auVar8._8_8_ = dVar7 + dVar9;
    uVar1 = vmovlpd_avx(auVar8);
    local_240[lVar4] = uVar1;
    lVar4 = lVar4 + 1;
    pdVar3 = pdVar3 + 6;
  } while (lVar4 != 6);
  local_1d0 = 0.0;
  dStack_1c8 = 0.0;
  local_1c0 = 0.0;
  local_1e0 = 0.0;
  local_1f0 = 0.0;
  dStack_1e8 = 0.0;
  (*(this->super_ChBeamSection)._vptr_ChBeamSection[0x10])(this,&local_1d0,&local_1f0,mWvel);
  local_1b8 = local_240;
  local_1b0 = 3;
  local_198 = 0;
  local_188 = 6;
  local_1a0 = local_1b8;
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
            (&local_208,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
             &local_1b8,(type *)0x0);
  mFi->m_data[0] = local_208.m_data[0] + local_1d0;
  mFi->m_data[1] = local_208.m_data[1] + dStack_1c8;
  mFi->m_data[2] = local_208.m_data[2] + local_1c0;
  local_1b8 = (undefined8 *)local_228;
  local_1b0 = 3;
  local_1a0 = local_240;
  local_198 = 3;
  local_188 = 6;
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
            (&local_208,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
             &local_1b8,(type *)0x0);
  mTi->m_data[0] = local_208.m_data[0] + local_1f0;
  mTi->m_data[1] = local_208.m_data[1] + dStack_1e8;
  mTi->m_data[2] = local_208.m_data[2] + local_1e0;
  return;
}

Assistant:

void ChBeamSectionEuler::ComputeInertialForce(
                                    ChVector<>& mFi,          ///< total inertial force returned here
                                    ChVector<>& mTi,          ///< total inertial torque returned here
                                    const ChVector<>& mWvel,  ///< current angular velocity of section, in material frame
                                    const ChVector<>& mWacc,  ///< current angular acceleration of section, in material frame
                                    const ChVector<>& mXacc   ///< current acceleration of section, in material frame (not absolute!)
	) {
		// Default implementation as Fi = [Mi]*{xacc,wacc}+{mF_quadratic,mT_quadratic}
		// but if possible implement it in children classes with ad-hoc faster formulas.
		ChMatrixNM<double, 6, 6> Mi;
		this->ComputeInertiaMatrix(Mi);
		ChVectorN<double, 6> xpp; 
		xpp.segment(0 , 3) = mXacc.eigen();
		xpp.segment(3 , 3) = mWacc.eigen();
		ChVectorN<double, 6> Fipp = Mi * xpp;    // [Mi]*{xacc,wacc}
		ChVector<> mF_quadratic;
		ChVector<> mT_quadratic;
		this->ComputeQuadraticTerms(mF_quadratic, mT_quadratic, mWvel);  // {mF_quadratic,mT_quadratic}
		mFi = ChVector<>(Fipp.segment(0, 3)) + mF_quadratic; 
		mTi = ChVector<>(Fipp.segment(3, 3)) + mT_quadratic;
	}